

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server_pull(int fd)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  server_hashes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string dir;
  string client_hash;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,(string *)&HEAD_abi_cxx11_);
  fileToMsg(&local_90,(Msg *)&server_hashes);
  std::__cxx11::string::~string((string *)&local_90);
  server_hashes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  send(fd,(Msg *)&server_hashes,0x7d4,0);
  recv(fd,(Msg *)&server_hashes,0x7d4,0x100);
  if ((int)server_hashes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start != 2) {
    std::__cxx11::string::string((string *)&local_130,&stack0x000003f4,(allocator *)&local_150);
    read_all_lines_abi_cxx11_(&local_190,HEAD_abi_cxx11_._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&local_f0,(string *)&HEAD_abi_cxx11_);
    fileToMsg(&local_f0,(Msg *)&server_hashes);
    std::__cxx11::string::~string((string *)&local_f0);
    server_hashes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    send(fd,(Msg *)&server_hashes,0x7d4,0);
    std::__cxx11::string::string((string *)&local_110,(string *)&LOG_abi_cxx11_);
    fileToMsg(&local_110,(Msg *)&server_hashes);
    std::__cxx11::string::~string((string *)&local_110);
    send(fd,(Msg *)&server_hashes,0x7d4,0);
    bVar1 = std::operator!=(&local_130,"");
    if (bVar1) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        lVar3 = lVar3 + 0x100000000;
        bVar1 = std::operator!=(&local_130,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((local_190.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar2));
        lVar2 = lVar2 + 0x20;
      } while (bVar1);
      uVar4 = lVar3 >> 0x20;
    }
    else {
      uVar4 = 0;
    }
    while (uVar4 < (ulong)((long)local_190.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_190.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::operator+(&local_170,&COMMITS_DIR_abi_cxx11_,"/");
      std::__cxx11::string::string
                ((string *)&local_d0,
                 (string *)
                 (local_190.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar4));
      deleteEndl(&local_50,&local_d0);
      std::operator+(&local_b0,&local_170,&local_50);
      std::operator+(&local_150,&local_b0,"/");
      local_178 = uVar4;
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_170);
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_170,local_150._M_dataplus._M_p);
      lVar2 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)(local_170._M_string_length - (long)local_170._M_dataplus._M_p) >> 5
                         ); uVar4 = uVar4 + 1) {
        std::operator+(&local_b0,&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_170._M_dataplus._M_p + lVar2));
        std::__cxx11::string::string((string *)&local_70,(string *)&local_b0);
        fileToMsg(&local_70,(Msg *)&server_hashes);
        std::__cxx11::string::~string((string *)&local_70);
        server_hashes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        send(fd,(Msg *)&server_hashes,0x7d4,0);
        std::__cxx11::string::~string((string *)&local_b0);
        lVar2 = lVar2 + 0x20;
      }
      uVar4 = local_178 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
    }
    server_hashes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
    send(fd,(Msg *)&server_hashes,0x7d4,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_190);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

void server_pull(int fd, Msg msg) {
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    recv(fd, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type == MSG_END) return;
    String client_hash = msg.buf2;
    Vector<String> server_hashes = read_all_lines(HEAD.c_str());
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    fileToMsg(LOG,msg);
    send(fd,&msg,sizeof(msg),0);
    int i = 0;
    if(client_hash != ""){
        while(client_hash != server_hashes[i]){
            i++;
        }
        i++;
    }
    while(i<server_hashes.size()){
        String dir = COMMITS_DIR + "/" + deleteEndl(server_hashes[i]) + "/";
        Vector<String> files = ls(dir.c_str());
        for(int j = 0; j < files.size();j++){
            String file = dir + files[j];
            fileToMsg(file,msg);
            msg.type = MSG_PULL;
            send(fd,&msg,sizeof(msg),0);
        }
        i++;
    }
    msg.type = MSG_END;
    send(fd,&msg,sizeof(msg),0);
}